

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute_acl(archive_read *a,tar *tar,archive_entry *entry,char *value,wchar_t type)

{
  wchar_t wVar1;
  archive_string_conv *paVar2;
  archive_acl *acl;
  char *local_40;
  char *errstr;
  wchar_t r;
  wchar_t type_local;
  char *value_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  if (type == L'Ā') {
    local_40 = "SCHILY.acl.access";
  }
  else if (type == L'Ȁ') {
    local_40 = "SCHILY.acl.default";
  }
  else {
    if (type != L'㰀') {
      archive_set_error(&a->archive,-1,"Unknown ACL type: %d",(ulong)(uint)type);
      return L'\xffffffe2';
    }
    local_40 = "SCHILY.acl.ace";
  }
  if (tar->sconv_acl == (archive_string_conv *)0x0) {
    paVar2 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    tar->sconv_acl = paVar2;
    if (tar->sconv_acl == (archive_string_conv *)0x0) {
      return L'\xffffffe2';
    }
  }
  acl = archive_entry_acl(entry);
  wVar1 = archive_acl_from_text_l(acl,value,type,tar->sconv_acl);
  if (wVar1 != L'\0') {
    if (wVar1 == L'\xffffffe2') {
      archive_set_error(&a->archive,0xc,"%s %s","Can\'t allocate memory for ",local_40);
    }
    else {
      archive_set_error(&a->archive,-1,"%s %s","Parse error: ",local_40);
    }
  }
  return wVar1;
}

Assistant:

static int
pax_attribute_acl(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const char *value, int type)
{
	int r;
	const char* errstr;

	switch (type) {
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
		errstr = "SCHILY.acl.access";
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		errstr = "SCHILY.acl.default";
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		errstr = "SCHILY.acl.ace";
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Unknown ACL type: %d", type);
		return(ARCHIVE_FATAL);
	}

	if (tar->sconv_acl == NULL) {
		tar->sconv_acl =
		    archive_string_conversion_from_charset(
			&(a->archive), "UTF-8", 1);
		if (tar->sconv_acl == NULL)
			return (ARCHIVE_FATAL);
	}

	r = archive_acl_from_text_l(archive_entry_acl(entry), value, type,
	    tar->sconv_acl);
	if (r != ARCHIVE_OK) {
		if (r == ARCHIVE_FATAL) {
			archive_set_error(&a->archive, ENOMEM,
			    "%s %s", "Can't allocate memory for ",
			    errstr);
			return (r);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC, "%s %s", "Parse error: ", errstr);
	}
	return (r);
}